

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

void __thiscall
soul::ResolutionPass::FunctionResolver::PossibleFunction::PossibleFunction
          (PossibleFunction *this,Function *f,ArrayView<soul::Type> argTypes,
          ArrayView<soul::pool_ptr<soul::AST::Constant>_> constantArgValues)

{
  StructurePtr SVar1;
  bool bVar2;
  Structure *pSVar3;
  reference pvVar4;
  VariableDeclaration *pVVar5;
  Type *pTVar6;
  pool_ptr<soul::AST::Constant> *ppVar7;
  Constant *pCVar8;
  Type local_80;
  undefined4 local_68;
  undefined1 local_58 [8];
  Type targetParamType;
  size_t i;
  Function *f_local;
  PossibleFunction *this_local;
  ArrayView<soul::pool_ptr<soul::AST::Constant>_> constantArgValues_local;
  ArrayView<soul::Type> argTypes_local;
  
  constantArgValues_local.s = constantArgValues.e;
  this_local = (PossibleFunction *)constantArgValues.s;
  constantArgValues_local.e = (pool_ptr<soul::AST::Constant> *)argTypes.s;
  this->function = f;
  this->isImpossible = false;
  this->requiresCast = false;
  this->requiresGeneric = false;
  this->functionIsNotResolved = false;
  targetParamType.structure.object = (Structure *)0x0;
  do {
    SVar1.object = targetParamType.structure.object;
    pSVar3 = (Structure *)
             ArrayView<soul::Type>::size((ArrayView<soul::Type> *)&constantArgValues_local.e);
    if (pSVar3 <= SVar1.object) {
      return;
    }
    Type::Type((Type *)local_58);
    pvVar4 = std::
             vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
             ::operator[](&this->function->parameters,(size_type)targetParamType.structure.object);
    pVVar5 = pool_ref<soul::AST::VariableDeclaration>::operator->(pvVar4);
    bVar2 = AST::VariableDeclaration::isResolved(pVVar5);
    if (bVar2) {
      pvVar4 = std::
               vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
               ::operator[](&this->function->parameters,(size_type)targetParamType.structure.object)
      ;
      pVVar5 = pool_ref<soul::AST::VariableDeclaration>::operator->(pvVar4);
      AST::VariableDeclaration::getType(&local_80,pVVar5);
      Type::operator=((Type *)local_58,&local_80);
      Type::~Type(&local_80);
      pTVar6 = ArrayView<soul::Type>::operator[]
                         ((ArrayView<soul::Type> *)&constantArgValues_local.e,
                          (size_t)targetParamType.structure.object);
      bVar2 = TypeRules::canPassAsArgumentTo((Type *)local_58,pTVar6,true);
      if (bVar2) {
        local_68 = 4;
      }
      else {
        pTVar6 = ArrayView<soul::Type>::operator[]
                           ((ArrayView<soul::Type> *)&constantArgValues_local.e,
                            (size_t)targetParamType.structure.object);
        bVar2 = TypeRules::canPassAsArgumentTo((Type *)local_58,pTVar6,false);
        if (!bVar2) {
          ppVar7 = ArrayView<soul::pool_ptr<soul::AST::Constant>_>::operator[]
                             ((ArrayView<soul::pool_ptr<soul::AST::Constant>_> *)&this_local,
                              (size_t)targetParamType.structure.object);
          bVar2 = pool_ptr<soul::AST::Constant>::operator==(ppVar7,(void *)0x0);
          if (!bVar2) {
            ppVar7 = ArrayView<soul::pool_ptr<soul::AST::Constant>_>::operator[]
                               ((ArrayView<soul::pool_ptr<soul::AST::Constant>_> *)&this_local,
                                (size_t)targetParamType.structure.object);
            pCVar8 = pool_ptr<soul::AST::Constant>::operator->(ppVar7);
            bVar2 = TypeRules::canSilentlyCastTo((Type *)local_58,&pCVar8->value);
            if (bVar2) goto LAB_003c3e21;
          }
          this->isImpossible = true;
        }
LAB_003c3e21:
        this->requiresCast = true;
        local_68 = 0;
      }
    }
    else {
      bVar2 = AST::Function::isGeneric(this->function);
      if (bVar2) {
        this->requiresGeneric = true;
      }
      else {
        this->functionIsNotResolved = true;
      }
      local_68 = 4;
    }
    Type::~Type((Type *)local_58);
    targetParamType.structure.object =
         (Structure *)
         ((long)&((targetParamType.structure.object)->super_RefCountedObject).refCount + 1);
  } while( true );
}

Assistant:

PossibleFunction (AST::Function& f, ArrayView<Type> argTypes,
                              ArrayView<pool_ptr<AST::Constant>> constantArgValues)
                : function (f)
            {
                for (size_t i = 0; i < argTypes.size(); ++i)
                {
                    Type targetParamType;

                    if (! function.parameters[i]->isResolved())
                    {
                        if (function.isGeneric())
                            requiresGeneric = true;
                        else
                            functionIsNotResolved = true;

                        continue;
                    }

                    targetParamType = function.parameters[i]->getType();

                    if (TypeRules::canPassAsArgumentTo (targetParamType, argTypes[i], true))
                        continue;

                    if (! TypeRules::canPassAsArgumentTo (targetParamType, argTypes[i], false))
                    {
                        if (constantArgValues[i] == nullptr
                             || ! TypeRules::canSilentlyCastTo (targetParamType, constantArgValues[i]->value))
                            isImpossible = true;
                    }

                    requiresCast = true;
                }
            }